

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O3

void loguru::print_preamble_header(char *out_buff,size_t out_buff_size)

{
  int iVar1;
  ulong uVar2;
  
  *out_buff = '\0';
  if (g_preamble_date == '\x01') {
    builtin_strncpy(out_buff,"date       ",0xc);
    uVar2 = 0xb;
  }
  else {
    uVar2 = 0;
  }
  if (g_preamble_time == '\x01') {
    iVar1 = snprintf(out_buff + uVar2,0x5c - uVar2,"time         ");
    uVar2 = uVar2 + (long)iVar1;
  }
  if ((g_preamble_uptime == '\x01') && (uVar2 < 0x5c)) {
    iVar1 = snprintf(out_buff + uVar2,0x5c - uVar2,"( uptime  ) ");
    uVar2 = uVar2 + (long)iVar1;
  }
  if ((g_preamble_thread == '\x01') && (uVar2 < 0x5c)) {
    iVar1 = snprintf(out_buff + uVar2,0x5c - uVar2,"[%-*s]",0x10," thread name/id");
    uVar2 = uVar2 + (long)iVar1;
  }
  if ((g_preamble_file == '\x01') && (uVar2 < 0x5c)) {
    iVar1 = snprintf(out_buff + uVar2,0x5c - uVar2,"%*s:line  ",0x17,"file");
    uVar2 = uVar2 + (long)iVar1;
  }
  if ((g_preamble_verbose == '\x01') && (uVar2 < 0x5c)) {
    iVar1 = snprintf(out_buff + uVar2,0x5c - uVar2,"   v");
    uVar2 = uVar2 + (long)iVar1;
  }
  if ((g_preamble_pipe == '\x01') && (uVar2 < 0x5c)) {
    snprintf(out_buff + uVar2,0x5c - uVar2,"| ");
    return;
  }
  return;
}

Assistant:

static void print_preamble_header(char* out_buff, size_t out_buff_size)
	{
		if (out_buff_size == 0) { return; }
		out_buff[0] = '\0';
		long pos = 0;
		if (g_preamble_date && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "date       ");
		}
		if (g_preamble_time && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "time         ");
		}
		if (g_preamble_uptime && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "( uptime  ) ");
		}
		if (g_preamble_thread && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "[%-*s]", LOGURU_THREADNAME_WIDTH, " thread name/id");
		}
		if (g_preamble_file && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "%*s:line  ", LOGURU_FILENAME_WIDTH, "file");
		}
		if (g_preamble_verbose && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "   v");
		}
		if (g_preamble_pipe && pos < out_buff_size) {
			pos += snprintf(out_buff + pos, out_buff_size - pos, "| ");
		}
	}